

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TFad<6,_double>,_3>::TPZManVector
          (TPZManVector<TFad<6,_double>,_3> *this,TPZManVector<TFad<6,_double>,_3> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  TFad<6,_double> *pTVar5;
  TPZVec<TFad<6,_double>_> *in_RSI;
  TPZVec<TFad<6,_double>_> *in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t size;
  TFad<6,_double> *in_stack_ffffffffffffff38;
  TFad<6,_double> *in_stack_ffffffffffffff40;
  TFad<6,_double> *local_98;
  TPZVec<TFad<6,_double>_> *local_38;
  long local_30;
  
  TPZVec<TFad<6,_double>_>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_024391e0;
  local_38 = in_RDI + 1;
  do {
    TFad<6,_double>::TFad(in_stack_ffffffffffffff40);
    local_38 = local_38 + 2;
  } while (local_38 != in_RDI + 7);
  uVar2 = TPZVec<TFad<6,_double>_>::NElements(in_RSI);
  if ((long)uVar2 < 4) {
    in_RDI->fStore = (TFad<6,_double> *)(in_RDI + 1);
    in_RDI->fNElements = uVar2;
    in_RDI->fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x40),0);
    uVar6 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x40),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = uVar2;
    pTVar5 = (TFad<6,_double> *)(puVar4 + 1);
    if (uVar2 != 0) {
      local_98 = pTVar5;
      do {
        TFad<6,_double>::TFad(in_stack_ffffffffffffff40);
        local_98 = local_98 + 1;
      } while (local_98 != pTVar5 + uVar2);
    }
    in_RDI->fStore = pTVar5;
    in_RDI->fNElements = uVar2;
    in_RDI->fNAlloc = uVar2;
  }
  for (local_30 = 0; local_30 < (long)uVar2; local_30 = local_30 + 1) {
    TFad<6,_double>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}